

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O3

int xmlOutputBufferWrite(xmlOutputBufferPtr out,int len,char *buf)

{
  xmlBufPtr *ppxVar1;
  xmlBufPtr *ppxVar2;
  xmlOutputWriteCallback p_Var3;
  void *pvVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  xmlBufPtr pxVar8;
  size_t sVar9;
  xmlChar *pxVar10;
  xmlBufPtr *ppxVar11;
  int iVar12;
  ulong uVar13;
  
  if ((out == (xmlOutputBufferPtr)0x0) || (out->error != 0)) {
LAB_0019df25:
    iVar12 = -1;
  }
  else if (len < 0) {
    iVar12 = 0;
  }
  else {
    ppxVar1 = &out->conv;
    ppxVar2 = &out->buffer;
    iVar12 = 0;
    do {
      uVar13 = 16000;
      if ((uint)len < 16000) {
        uVar13 = (ulong)(uint)len;
      }
      uVar7 = (uint)uVar13;
      if (out->encoder == (xmlCharEncodingHandlerPtr)0x0) {
        iVar5 = xmlBufAdd(*ppxVar2,(xmlChar *)buf,uVar7);
        uVar6 = uVar7;
        if (iVar5 != 0) goto LAB_0019df25;
      }
      else {
        if (*ppxVar1 == (xmlBufPtr)0x0) {
          pxVar8 = xmlBufCreate();
          *ppxVar1 = pxVar8;
        }
        iVar5 = xmlBufAdd(*ppxVar2,(xmlChar *)buf,uVar7);
        if (iVar5 != 0) goto LAB_0019df25;
        sVar9 = xmlBufUse(*ppxVar2);
        if (sVar9 < 4000 && (uint)len < 0x3e81) {
          return iVar12;
        }
        uVar6 = xmlCharEncOutput(out,0);
        if (uVar6 != 0xfffffffd && (int)uVar6 < 0) {
          iVar12 = 0x608;
          __xmlSimpleError(8,0x608,(xmlNodePtr)0x0,"encoder error",(char *)0x0);
          uVar7 = 0xffffffff;
          goto LAB_0019e124;
        }
        if ((int)uVar6 < 1) {
          uVar6 = 0;
        }
      }
      len = len - uVar7;
      p_Var3 = out->writecallback;
      if (p_Var3 != (xmlOutputWriteCallback)0x0) {
        if (uVar6 < 4000 && len < 1) {
          return iVar12;
        }
        pvVar4 = out->context;
        if (out->encoder == (xmlCharEncodingHandlerPtr)0x0) {
          pxVar10 = xmlBufContent(*ppxVar2);
          uVar7 = (*p_Var3)(pvVar4,(char *)pxVar10,uVar6);
          ppxVar11 = ppxVar2;
        }
        else {
          pxVar10 = xmlBufContent(*ppxVar1);
          uVar7 = (*p_Var3)(pvVar4,(char *)pxVar10,uVar6);
          ppxVar11 = ppxVar1;
        }
        if ((int)uVar7 < 0) {
          iVar12 = 0x60a;
          __xmlSimpleError(8,0x60a,(xmlNodePtr)0x0,"write error",(char *)0x0);
LAB_0019e124:
          out->error = iVar12;
          return uVar7;
        }
        xmlBufShrink(*ppxVar11,(ulong)uVar7);
        iVar5 = out->written + uVar7;
        if ((int)(uVar7 ^ 0x7fffffff) < out->written) {
          iVar5 = 0x7fffffff;
        }
        out->written = iVar5;
      }
      buf = (char *)((xmlChar *)buf + uVar13);
      iVar12 = iVar12 + uVar6;
    } while (0 < len);
  }
  return iVar12;
}

Assistant:

int
xmlOutputBufferWrite(xmlOutputBufferPtr out, int len, const char *buf) {
    int nbchars = 0; /* number of chars to output to I/O */
    int ret;         /* return from function call */
    int written = 0; /* number of char written to I/O so far */
    int chunk;       /* number of byte current processed from buf */

    if ((out == NULL) || (out->error)) return(-1);
    if (len < 0) return(0);
    if (out->error) return(-1);

    do {
	chunk = len;
	if (chunk > 4 * MINLEN)
	    chunk = 4 * MINLEN;

	/*
	 * first handle encoding stuff.
	 */
	if (out->encoder != NULL) {
	    /*
	     * Store the data in the incoming raw buffer
	     */
	    if (out->conv == NULL) {
		out->conv = xmlBufCreate();
	    }
	    ret = xmlBufAdd(out->buffer, (const xmlChar *) buf, chunk);
	    if (ret != 0)
	        return(-1);

	    if ((xmlBufUse(out->buffer) < MINLEN) && (chunk == len))
		goto done;

	    /*
	     * convert as much as possible to the parser reading buffer.
	     */
	    ret = xmlCharEncOutput(out, 0);
	    if ((ret < 0) && (ret != -3)) {
		xmlIOErr(XML_IO_ENCODER, NULL);
		out->error = XML_IO_ENCODER;
		return(-1);
	    }
            nbchars = ret >= 0 ? ret : 0;
	} else {
	    ret = xmlBufAdd(out->buffer, (const xmlChar *) buf, chunk);
	    if (ret != 0)
	        return(-1);
            nbchars = chunk;
	}
	buf += chunk;
	len -= chunk;

	if (out->writecallback) {
            if ((nbchars < MINLEN) && (len <= 0))
                goto done;

	    /*
	     * second write the stuff to the I/O channel
	     */
	    if (out->encoder != NULL) {
		ret = out->writecallback(out->context,
                           (const char *)xmlBufContent(out->conv), nbchars);
		if (ret >= 0)
		    xmlBufShrink(out->conv, ret);
	    } else {
		ret = out->writecallback(out->context,
                           (const char *)xmlBufContent(out->buffer), nbchars);
		if (ret >= 0)
		    xmlBufShrink(out->buffer, ret);
	    }
	    if (ret < 0) {
		xmlIOErr(XML_IO_WRITE, NULL);
		out->error = XML_IO_WRITE;
		return(ret);
	    }
            if (out->written > INT_MAX - ret)
                out->written = INT_MAX;
            else
                out->written += ret;
	}
	written += nbchars;
    } while (len > 0);

done:
#ifdef DEBUG_INPUT
    xmlGenericError(xmlGenericErrorContext,
	    "I/O: wrote %d chars\n", written);
#endif
    return(written);
}